

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_TestTypeRelations_Test::~TypeTest_TestTypeRelations_Test
          (TypeTest_TestTypeRelations_Test *this)

{
  TypeTest_TestTypeRelations_Test *this_local;
  
  ~TypeTest_TestTypeRelations_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TypeTest, TestTypeRelations) {
  HeapType definedSuper, definedSub;
  {
    TypeBuilder builder(2);
    builder[0].setOpen() = Struct();
    builder[1] = Struct();
    builder[1].subTypeOf(builder[0]);
    auto built = builder.build();
    ASSERT_TRUE(built);
    definedSuper = (*built)[0];
    definedSub = (*built)[1];
  }

  Type any = Type(HeapType::any, NonNullable, Inexact);
  Type nullAny = Type(HeapType::any, Nullable, Inexact);

  Type sup = Type(definedSuper, NonNullable, Inexact);
  Type nullSup = Type(definedSuper, Nullable, Inexact);
  Type exactSup = Type(definedSuper, NonNullable, Exact);
  Type nullExactSup = Type(definedSuper, Nullable, Exact);

  Type sub = Type(definedSub, NonNullable, Inexact);
  Type nullSub = Type(definedSub, Nullable, Inexact);
  Type exactSub = Type(definedSub, NonNullable, Exact);
  Type nullExactSub = Type(definedSub, Nullable, Exact);

  Type none = Type(HeapType::none, NonNullable, Inexact);
  Type nullNone = Type(HeapType::none, Nullable, Inexact);

  Type func = Type(HeapType::func, NonNullable, Inexact);
  Type nullFunc = Type(HeapType::func, Nullable, Inexact);

  Type i32 = Type::i32;
  Type unreachable = Type::unreachable;

  auto assertLUB = [](Type a, Type b, Type lub, Type glb) {
    auto lub1 = Type::getLeastUpperBound(a, b);
    auto lub2 = Type::getLeastUpperBound(b, a);
    EXPECT_EQ(lub, lub1);
    EXPECT_EQ(lub1, lub2);
    if (lub != Type::none) {
      EXPECT_TRUE(Type::isSubType(a, lub));
      EXPECT_TRUE(Type::isSubType(b, lub));
    }
    auto glb1 = Type::getGreatestLowerBound(a, b);
    auto glb2 = Type::getGreatestLowerBound(b, a);
    EXPECT_EQ(glb, glb1);
    EXPECT_EQ(glb, glb2);
    EXPECT_TRUE(Type::isSubType(glb, a));
    EXPECT_TRUE(Type::isSubType(glb, b));
    if (a == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(lub, a);
      EXPECT_EQ(glb, a);
    } else if (lub == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_EQ(glb, a);
    } else if (lub == a) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(glb, b);
    } else if (lub != Type::none) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_NE(glb, a);
      EXPECT_NE(glb, b);
    } else {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
    }

    if (a.isRef() && b.isRef()) {
      auto htA = a.getHeapType();
      auto htB = b.getHeapType();

      if (lub == Type::none) {
        EXPECT_NE(htA.getTop(), htB.getTop());
        EXPECT_NE(htA.getBottom(), htB.getBottom());
      } else {
        EXPECT_EQ(htA.getTop(), htB.getTop());
        EXPECT_EQ(htA.getBottom(), htB.getBottom());
      }
    }
  };

  assertLUB(any, any, any, any);
  assertLUB(any, nullAny, nullAny, any);
  assertLUB(any, sup, any, sup);
  assertLUB(any, nullSup, nullAny, sup);
  assertLUB(any, exactSup, any, exactSup);
  assertLUB(any, nullExactSup, nullAny, exactSup);
  assertLUB(any, sub, any, sub);
  assertLUB(any, nullSub, nullAny, sub);
  assertLUB(any, exactSub, any, exactSub);
  assertLUB(any, nullExactSub, nullAny, exactSub);
  assertLUB(any, none, any, none);
  assertLUB(any, nullNone, nullAny, none);
  assertLUB(any, func, Type(Type::none), unreachable);
  assertLUB(any, nullFunc, Type(Type::none), unreachable);
  assertLUB(any, i32, Type(Type::none), unreachable);
  assertLUB(any, unreachable, any, unreachable);

  assertLUB(nullAny, nullAny, nullAny, nullAny);
  assertLUB(nullAny, sup, nullAny, sup);
  assertLUB(nullAny, nullSup, nullAny, nullSup);
  assertLUB(nullAny, exactSup, nullAny, exactSup);
  assertLUB(nullAny, nullExactSup, nullAny, nullExactSup);
  assertLUB(nullAny, sub, nullAny, sub);
  assertLUB(nullAny, nullSub, nullAny, nullSub);
  assertLUB(nullAny, exactSub, nullAny, exactSub);
  assertLUB(nullAny, nullExactSub, nullAny, nullExactSub);
  assertLUB(nullAny, none, nullAny, none);
  assertLUB(nullAny, nullNone, nullAny, nullNone);
  assertLUB(nullAny, func, Type(Type::none), unreachable);
  assertLUB(nullAny, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullAny, i32, Type(Type::none), unreachable);
  assertLUB(nullAny, unreachable, nullAny, unreachable);

  assertLUB(sup, sup, sup, sup);
  assertLUB(sup, nullSup, nullSup, sup);
  assertLUB(sup, exactSup, sup, exactSup);
  assertLUB(sup, nullExactSup, nullSup, exactSup);
  assertLUB(sup, sub, sup, sub);
  assertLUB(sup, nullSub, nullSup, sub);
  assertLUB(sup, exactSub, sup, exactSub);
  assertLUB(sup, nullExactSub, nullSup, exactSub);
  assertLUB(sup, none, sup, none);
  assertLUB(sup, nullNone, nullSup, none);
  assertLUB(sup, func, Type(Type::none), unreachable);
  assertLUB(sup, nullFunc, Type(Type::none), unreachable);
  assertLUB(sup, i32, Type(Type::none), unreachable);
  assertLUB(sup, unreachable, sup, unreachable);

  assertLUB(nullSup, nullSup, nullSup, nullSup);
  assertLUB(nullSup, exactSup, nullSup, exactSup);
  assertLUB(nullSup, nullExactSup, nullSup, nullExactSup);
  assertLUB(nullSup, sub, nullSup, sub);
  assertLUB(nullSup, nullSub, nullSup, nullSub);
  assertLUB(nullSup, exactSub, nullSup, exactSub);
  assertLUB(nullSup, nullExactSub, nullSup, nullExactSub);
  assertLUB(nullSup, none, nullSup, none);
  assertLUB(nullSup, nullNone, nullSup, nullNone);
  assertLUB(nullSup, func, Type(Type::none), unreachable);
  assertLUB(nullSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSup, i32, Type(Type::none), unreachable);
  assertLUB(nullSup, unreachable, nullSup, unreachable);

  assertLUB(exactSup, exactSup, exactSup, exactSup);
  assertLUB(exactSup, nullExactSup, nullExactSup, exactSup);
  assertLUB(exactSup, sub, sup, none);
  assertLUB(exactSup, nullSub, nullSup, none);
  assertLUB(exactSup, exactSub, sup, none);
  assertLUB(exactSup, nullExactSub, nullSup, none);
  assertLUB(exactSup, none, exactSup, none);
  assertLUB(exactSup, nullNone, nullExactSup, none);
  assertLUB(exactSup, func, Type(Type::none), unreachable);
  assertLUB(exactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSup, i32, Type(Type::none), unreachable);
  assertLUB(exactSup, unreachable, exactSup, unreachable);

  assertLUB(nullExactSup, nullExactSup, nullExactSup, nullExactSup);
  assertLUB(nullExactSup, sub, nullSup, none);
  assertLUB(nullExactSup, nullSub, nullSup, nullNone);
  assertLUB(nullExactSup, exactSub, nullSup, none);
  assertLUB(nullExactSup, nullExactSub, nullSup, nullNone);
  assertLUB(nullExactSup, none, nullExactSup, none);
  assertLUB(nullExactSup, nullNone, nullExactSup, nullNone);
  assertLUB(nullExactSup, func, Type(Type::none), unreachable);
  assertLUB(nullExactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSup, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSup, unreachable, nullExactSup, unreachable);

  assertLUB(sub, sub, sub, sub);
  assertLUB(sub, nullSub, nullSub, sub);
  assertLUB(sub, exactSub, sub, exactSub);
  assertLUB(sub, nullExactSub, nullSub, exactSub);
  assertLUB(sub, none, sub, none);
  assertLUB(sub, nullNone, nullSub, none);
  assertLUB(sub, func, Type(Type::none), unreachable);
  assertLUB(sub, nullFunc, Type(Type::none), unreachable);
  assertLUB(sub, i32, Type(Type::none), unreachable);
  assertLUB(sub, unreachable, sub, unreachable);

  assertLUB(nullSub, nullSub, nullSub, nullSub);
  assertLUB(nullSub, exactSub, nullSub, exactSub);
  assertLUB(nullSub, nullExactSub, nullSub, nullExactSub);
  assertLUB(nullSub, none, nullSub, none);
  assertLUB(nullSub, nullNone, nullSub, nullNone);
  assertLUB(nullSub, func, Type(Type::none), unreachable);
  assertLUB(nullSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSub, i32, Type(Type::none), unreachable);
  assertLUB(nullSub, unreachable, nullSub, unreachable);

  assertLUB(exactSub, exactSub, exactSub, exactSub);
  assertLUB(exactSub, nullExactSub, nullExactSub, exactSub);
  assertLUB(exactSub, none, exactSub, none);
  assertLUB(exactSub, nullNone, nullExactSub, none);
  assertLUB(exactSub, func, Type(Type::none), unreachable);
  assertLUB(exactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSub, i32, Type(Type::none), unreachable);
  assertLUB(exactSub, unreachable, exactSub, unreachable);

  assertLUB(nullExactSub, nullExactSub, nullExactSub, nullExactSub);
  assertLUB(nullExactSub, none, nullExactSub, none);
  assertLUB(nullExactSub, nullNone, nullExactSub, nullNone);
  assertLUB(nullExactSub, func, Type(Type::none), unreachable);
  assertLUB(nullExactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSub, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSub, unreachable, nullExactSub, unreachable);

  assertLUB(none, none, none, none);
  assertLUB(none, nullNone, nullNone, none);
  assertLUB(none, func, Type(Type::none), unreachable);
  assertLUB(none, nullFunc, Type(Type::none), unreachable);
  assertLUB(none, i32, Type(Type::none), unreachable);
  assertLUB(none, unreachable, none, unreachable);

  assertLUB(nullNone, nullNone, nullNone, nullNone);
  assertLUB(nullNone, func, Type(Type::none), unreachable);
  assertLUB(nullNone, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullNone, i32, Type(Type::none), unreachable);
  assertLUB(nullNone, unreachable, nullNone, unreachable);
}